

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall embree::SceneGraph::MultiTransformNode::calculateInDegree(MultiTransformNode *this)

{
  size_t sVar1;
  pointer pTVar2;
  Node *pNVar3;
  long lVar4;
  undefined8 in_RSI;
  long lVar5;
  size_t i;
  ulong uVar6;
  
  sVar1 = (this->super_Node).indegree;
  (this->super_Node).indegree = sVar1 + 1;
  if (sVar1 != 0) {
    return;
  }
  (*(((this->child).ptr)->super_RefCount)._vptr_RefCount[6])();
  lVar5 = 0x10;
  uVar6 = 0;
  while( true ) {
    pTVar2 = (this->spaces).
             super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->spaces).
                  super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2;
    if ((ulong)(lVar4 / 0x30) <= uVar6) break;
    if (1 < *(ulong *)((long)&(pTVar2->time_range).lower + lVar5)) {
      pNVar3 = (this->child).ptr;
      (*(pNVar3->super_RefCount)._vptr_RefCount[6])(pNVar3,in_RSI,lVar4 % 0x30);
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x30;
  }
  return;
}

Assistant:

void SceneGraph::MultiTransformNode::calculateInDegree()
  {
    indegree++;
    if (indegree == 1) {
      child->calculateInDegree();
      for (size_t i = 0; i < spaces.size(); ++i)
        if (spaces[i].size() > 1) child->calculateInDegree(); // break instance up when motion blur is used
    }
  }